

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>
wasm::Builder::makeTable(Name name,Type type,Address initial,Address max)

{
  pointer pTVar1;
  __uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true> this;
  address64_t in_R9;
  Address max_local;
  Address initial_local;
  Type type_local;
  Name name_local;
  __single_object *table;
  
  type_local.id = name.super_IString.str._M_str;
  this.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl = name.super_IString.str._M_len;
  std::make_unique<wasm::Table>();
  pTVar1 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                     ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                      this.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                      _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
  Name::operator=((Name *)pTVar1,(Name *)&type_local);
  pTVar1 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                     ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                      this.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                      _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
  (pTVar1->type).id = initial.addr;
  pTVar1 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                     ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                      this.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                      _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
  (pTVar1->initial).addr = max.addr;
  pTVar1 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                     ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                      this.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                      _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
  (pTVar1->max).addr = in_R9;
  return (__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
         (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)
         this.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<Table> makeTable(Name name,
                                          Type type = Type(HeapType::func,
                                                           Nullable),
                                          Address initial = 0,
                                          Address max = Table::kMaxSize) {
    auto table = std::make_unique<Table>();
    table->name = name;
    table->type = type;
    table->initial = initial;
    table->max = max;
    return table;
  }